

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullDevice.cpp
# Opt level: O0

void lateLoadNullDevice(void)

{
  int iVar1;
  string *in_stack_000000f0;
  MakeFunction *in_stack_000000f8;
  FindFunction *in_stack_00000100;
  string *in_stack_00000108;
  Registry *in_stack_00000110;
  allocator local_69;
  string local_68 [32];
  code *local_48;
  code *local_40;
  allocator local_21;
  string local_20 [32];
  
  if (lateLoadNullDevice()::registerNullDevice == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadNullDevice()::registerNullDevice);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,"null",&local_21);
      local_40 = findNullDevice;
      local_48 = makeNullDevice;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"0.7",&local_69);
      SoapySDR::Registry::Registry
                (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                 in_stack_000000f0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::__cxx11::string::~string(local_20);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(SoapySDR::Registry::~Registry,&lateLoadNullDevice::registerNullDevice,
                   &__dso_handle);
      __cxa_guard_release(&lateLoadNullDevice()::registerNullDevice);
    }
  }
  return;
}

Assistant:

void lateLoadNullDevice(void)
{
    static SoapySDR::Registry registerNullDevice("null", &findNullDevice, &makeNullDevice, SOAPY_SDR_ABI_VERSION);
}